

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O1

int __thiscall
soplex::CLUFactorRational::vSolveRight4update
          (CLUFactorRational *this,Rational *vec,int *idx,Rational *rhs,int *ridx,int rn,
          Rational *forest,int *forestNum,int *forestIdx)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  CLUFactorRational *this_00;
  Rational *vec_00;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *pcVar9;
  Rational x;
  type t;
  uint local_114;
  int *local_108;
  data_type local_f8;
  undefined4 local_e8;
  undefined2 local_e4;
  char local_e2;
  data_type local_d8;
  undefined4 local_c8;
  undefined2 local_c4;
  char local_c2;
  CLUFactorRational *local_b0;
  Rational *local_a8;
  longlong local_a0;
  Rational *local_98;
  int *local_90;
  data_type local_88;
  char local_73;
  char local_72;
  uint local_68;
  void *local_60;
  char local_53;
  char local_52;
  int *local_40;
  ulong local_38;
  
  local_b0 = this;
  local_a8 = rhs;
  local_98 = vec;
  local_90 = idx;
  uVar4 = vSolveLright(this,rhs,ridx,rn);
  if (forest == (Rational *)0x0) {
    local_f8.la[0] = 0;
    local_e8 = 1;
    local_e4 = 0x100;
    local_e2 = '\0';
    local_d8.la[0] = 1;
    local_c8 = 1;
    local_c4 = 0x100;
    local_114 = 0;
    local_c2 = '\0';
    if (0 < (int)uVar4) {
      piVar2 = (local_b0->row).perm;
      uVar7 = 0;
      local_114 = 0;
      do {
        iVar6 = ridx[uVar7];
        pcVar9 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)(local_a8 + iVar6);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_f8.ld,pcVar9);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_d8.ld,pcVar9 + 1);
        local_a0 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_88.ld,&local_a0,(type *)0x0);
        iVar5 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_f8.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_88.ld);
        if ((local_53 == '\0') && (local_52 == '\0')) {
          operator_delete(local_60,(ulong)local_68 << 3);
        }
        if ((local_73 == '\0') && (local_72 == '\0')) {
          operator_delete(local_88.ld.data,(local_88.la[0] & 0xffffffff) << 3);
        }
        if (iVar5 == 0) {
          local_88.la[0] = 0;
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
          ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                       *)pcVar9,(longlong *)local_88.la);
        }
        else {
          iVar6 = piVar2[iVar6];
          uVar8 = local_114;
          if (0 < (int)local_114) {
            do {
              uVar1 = uVar8 - 1;
              uVar3 = uVar1 >> 1;
              if (iVar6 <= ridx[uVar3]) break;
              ridx[uVar8] = ridx[uVar3];
              uVar8 = uVar3;
            } while (1 < uVar1);
          }
          local_114 = local_114 + 1;
          ridx[(int)uVar8] = iVar6;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar4);
    }
  }
  else {
    local_f8.la[0] = 0;
    local_e8 = 1;
    local_e4 = 0x100;
    local_e2 = '\0';
    local_d8.la[0] = 1;
    local_c8 = 1;
    local_c4 = 0x100;
    local_114 = 0;
    local_c2 = '\0';
    if (0 < (int)uVar4) {
      local_108 = forestIdx;
      local_40 = (local_b0->row).perm;
      local_38 = (ulong)uVar4;
      uVar7 = 0;
      local_114 = 0;
      do {
        iVar6 = ridx[uVar7];
        pcVar9 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)(local_a8 + iVar6);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_f8.ld,pcVar9);
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&local_d8.ld,pcVar9 + 1);
        local_a0 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_88.ld,&local_a0,(type *)0x0);
        iVar5 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_f8.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_88.ld);
        if ((local_53 == '\0') && (local_52 == '\0')) {
          operator_delete(local_60,(ulong)local_68 << 3);
        }
        if ((local_73 == '\0') && (local_72 == '\0')) {
          operator_delete(local_88.ld.data,(local_88.la[0] & 0xffffffff) << 3);
        }
        if (iVar5 == 0) {
          local_88.la[0] = 0;
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
          ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                       *)pcVar9,(longlong *)local_88.la);
        }
        else {
          *local_108 = iVar6;
          iVar5 = local_40[iVar6];
          uVar4 = local_114;
          if (0 < (int)local_114) {
            do {
              uVar8 = uVar4 - 1;
              uVar1 = uVar8 >> 1;
              if (iVar5 <= ridx[uVar1]) break;
              ridx[uVar4] = ridx[uVar1];
              uVar4 = uVar1;
            } while (1 < uVar8);
          }
          ridx[(int)uVar4] = iVar5;
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)(forest + iVar6),
                   (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_f8.ld);
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)(forest + iVar6) + 1,
                   (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_d8.ld);
          local_108 = local_108 + 1;
          local_114 = local_114 + 1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != local_38);
    }
    *forestNum = local_114;
  }
  if ((local_c4._1_1_ == '\0') && (local_c2 == '\0')) {
    operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
  }
  piVar2 = local_90;
  vec_00 = local_98;
  if ((local_e4._1_1_ == '\0') && (local_e2 == '\0')) {
    operator_delete(local_f8.ld.data,(local_f8.la[0] & 0xffffffff) << 3);
  }
  this_00 = local_b0;
  iVar6 = vSolveUright(local_b0,vec_00,piVar2,local_a8,ridx,local_114);
  if ((this_00->l).updateType == 0) {
    iVar6 = vSolveUpdateRight(this_00,vec_00,piVar2,iVar6);
  }
  return iVar6;
}

Assistant:

inline int CLUFactorRational::vSolveRight4update(Rational* vec,
      int* idx,                              /* result */
      Rational* rhs, int* ridx, int rn,                    /* rhs    */
      Rational* forest, int* forestNum, int* forestIdx)
{
   rn = vSolveLright(rhs, ridx, rn);

   /*  turn index list into a heap
    */

   if(forest)
   {
      Rational x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(x != 0)
         {
            enQueueMaxRat(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      Rational x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(x != 0)
            enQueueMaxRat(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
      rn = vSolveUpdateRight(vec, idx, rn);

   return rn;
}